

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

bool __thiscall
libchars::command_cursor::command(command_cursor *this,filter_t mask,bool ignore_hidden)

{
  _Elt_pointer ppcVar1;
  command_node *pcVar2;
  _Elt_pointer ppcVar3;
  command *pcVar4;
  
  ppcVar3 = (this->S).c.
            super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppcVar3 ==
      (this->S).c.
      super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>._M_impl
      .super__Deque_impl_data._M_start._M_cur) {
    pcVar2 = this->root;
    if (pcVar2 == (command_node *)0x0) {
      return (bool)0;
    }
    if ((pcVar2->mask & mask) == 0) {
      return (bool)0;
    }
    if (pcVar2->hidden == true && !ignore_hidden) {
      return (bool)0;
    }
    pcVar4 = pcVar2->cmd;
    if (pcVar4 == (command *)0x0) {
      return (bool)0;
    }
    if ((pcVar4->mask & mask) == 0) {
      return (bool)0;
    }
    goto LAB_0010af9d;
  }
  ppcVar1 = (this->S).c.
            super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first;
  if (ppcVar3 == ppcVar1) {
    if ((this->S).c.
        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f] == (command_node *)0x0) {
      return (bool)0;
    }
    if (((this->S).c.
         super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
         _M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f]->mask & mask) == 0) {
      return (bool)0;
    }
    if ((this->S).c.
        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f]->hidden == true && !ignore_hidden
       ) {
      return (bool)0;
    }
    if (ppcVar3 != ppcVar1) goto LAB_0010af2e;
    if ((this->S).c.
        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f]->cmd == (command *)0x0) {
      return (bool)0;
    }
LAB_0010af67:
    if (((this->S).c.
         super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
         _M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f]->cmd->mask & mask) == 0) {
      return false;
    }
    if (ppcVar3 == ppcVar1) {
      ppcVar3 = (this->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
  }
  else {
    if (ppcVar3[-1] == (command_node *)0x0) {
      return (bool)0;
    }
    if ((ppcVar3[-1]->mask & mask) == 0) {
      return (bool)0;
    }
    if (ppcVar3[-1]->hidden == true && !ignore_hidden) {
      return (bool)0;
    }
LAB_0010af2e:
    if (ppcVar3[-1]->cmd == (command *)0x0) {
      return (bool)0;
    }
    if (ppcVar3 == ppcVar1) goto LAB_0010af67;
    if ((ppcVar3[-1]->cmd->mask & mask) == 0) {
      return (bool)0;
    }
  }
  pcVar4 = ppcVar3[-1]->cmd;
LAB_0010af9d:
  return (bool)(pcVar4->hidden ^ 1U | ignore_hidden);
}

Assistant:

bool command_cursor::command(command::filter_t mask, bool ignore_hidden) const
    {
        return valid() &&
               (current()->mask & mask) != 0 &&
               (!current()->hidden || ignore_hidden) &&
               current()->cmd != NULL &&
               (current()->cmd->mask & mask) != 0 &&
               (!current()->cmd->hidden || ignore_hidden);
    }